

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O3

uint32_t farmhashsu::Hash32(char *s,size_t len)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  char *pcVar5;
  long lVar6;
  uint uVar7;
  uint32_t uVar8;
  long lVar9;
  uint uVar10;
  undefined4 uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  uVar12 = (uint)len;
  if (0x18 < len) {
    if (len < 0x28) {
      uVar10 = *(int *)(s + (len - 4)) + uVar12;
      iVar22 = *(int *)(s + (len - 0x14)) + -0x4a380c7d;
      uVar13 = uVar10 >> 0x15 | uVar10 * 0x800;
      uVar7 = crc32(*(int *)(s + (len - 0x10)) + uVar12 + -0x4a380c7d,uVar10);
      uVar7 = (iVar22 * 0x16a88000 | (uint)(iVar22 * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar7;
      uVar7 = (uVar13 * 0x16a88000 | uVar13 * -0x3361d2af >> 0x11) * 0x1b873593 ^
              (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
      uVar18 = len + 1 >> 2;
      uVar17 = len + 1 >> 1;
      iVar21 = *(int *)(s + (uVar17 - 8));
      iVar14 = (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + *(int *)(s + (len - 0xc)) + -0x19ab949c;
      uVar10 = uVar10 + iVar14;
      uVar7 = ((iVar22 + *(int *)(s + (len - 8))) * 0x16a88000 |
              (uint)((iVar22 + *(int *)(s + (len - 8))) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              uVar10;
      iVar22 = (uVar7 >> 0x13 | uVar7 << 0xd) * -0x765bf421;
      uVar12 = crc32(iVar14 + uVar10,iVar22 + -0x5fc6ae11 + *(int *)(s + (len - 0x10)) + uVar12);
      uVar10 = (*(uint *)(s + (uVar18 - 4)) >> 0xc | *(uint *)(s + (uVar18 - 4)) << 0x14) +
               *(int *)(s + (uVar17 - 4));
      iVar14 = (uVar10 >> 3 | uVar10 * 0x20000000) + iVar21;
      uVar7 = (iVar21 * 0x16a88000 | (uint)(iVar21 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (int)uVar17 + *(int *)(s + uVar18) * -0x3361d2af + uVar12;
      uVar13 = iVar14 + *(int *)(s + (uVar17 - 4));
      uVar7 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + uVar10 + 0xe6546b64;
      uVar12 = ((uVar12 ^ *(uint *)(s + 4)) * 0x16a88000 |
               (uVar12 ^ *(uint *)(s + 4)) * -0x3361d2af >> 0x11) * 0x1b873593 ^
               (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + iVar14 + -0x19ab949c;
      uVar12 = (uVar13 >> 0xc | uVar13 * 0x100000) + *(int *)(s + uVar18) + -0x19ab949c +
               (uVar12 >> 0x13 | uVar12 << 0xd) * 5;
      uVar12 = (uVar12 >> 0x10 ^ uVar12) * -0x7a143595;
      uVar12 = (uVar12 >> 0xd ^ uVar12) * -0x3d4d51cb;
      uVar8 = (uVar12 >> 0x10 ^ uVar12) + 0xea715e6c + iVar22;
    }
    else {
      if (len < 0x50) {
        auVar35._8_4_ = 0xcc9e2d51;
        auVar35._0_8_ = 0xcc9e2d51cc9e2d51;
        auVar35._12_4_ = 0xcc9e2d51;
        auVar29._8_4_ = 0xbe0c56a1;
        auVar29._0_8_ = 0xbe0c56a1be0c56a1;
        auVar29._12_4_ = 0xbe0c56a1;
        auVar28 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar35);
        auVar27 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0xf >> 1)),auVar29);
        auVar30 = vpaddd_avx(*(undefined1 (*) [16])(s + 0x10),auVar29);
        auVar25 = vpaddd_avx(*(undefined1 (*) [16])s,auVar27);
        auVar28 = vpaddd_avx(auVar28,*(undefined1 (*) [16])(s + 0x10));
        auVar24._8_4_ = 0x51;
        auVar24._0_8_ = 0x5100000051;
        auVar24._12_4_ = 0x51;
        auVar23 = vpaddd_avx512vl(auVar25,auVar24);
        auVar25 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x20)),auVar35);
        auVar32 = vpshufd_avx(auVar30,0x39);
        auVar24 = vprold_avx512vl(auVar25,0x11);
        auVar25._8_4_ = 0x1b873593;
        auVar25._0_8_ = 0x1b8735931b873593;
        auVar25._12_4_ = 0x1b873593;
        auVar25 = vpmulld_avx512vl(auVar24,auVar25);
        auVar27 = vpaddd_avx(auVar23,auVar27);
        auVar25 = vprold_avx512vl(auVar25 ^ auVar23,0x13);
        auVar23 = vpslld_avx(auVar25,2);
        auVar25 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar25);
        auVar33._8_4_ = 0xe6546b64;
        auVar33._0_8_ = 0xe6546b64e6546b64;
        auVar33._12_4_ = 0xe6546b64;
        auVar25 = vpaddd_avx(auVar25,auVar23);
        auVar24 = vpshufb_avx(auVar32,auVar27);
        auVar32 = vpaddd_avx(auVar32 ^ *(undefined1 (*) [16])(s + (len - 0xf >> 1)),
                             *(undefined1 (*) [16])s);
        auVar23 = vpaddd_avx(auVar28 ^ auVar27,*(undefined1 (*) [16])(s + (len - 0x20)));
        auVar27 = vpaddd_avx(auVar25,auVar33);
        auVar26 = vpbroadcastd_avx512vl();
        auVar29 = vpshufb_avx(auVar23,auVar27);
        auVar28 = vpaddd_avx(auVar28,auVar24 ^ auVar33);
        auVar25 = vpaddd_avx(auVar32,auVar23);
        auVar28 = vpaddd_avx(auVar28,auVar29);
        auVar32 = vpaddd_avx(auVar32,auVar25);
        auVar32 = vpmulld_avx(auVar32,auVar35);
        auVar32 = vpaddd_avx(auVar32,auVar26);
      }
      else {
        uVar17 = (len - 1) / 0x50;
        lVar6 = uVar17 * 0x50;
        lVar9 = len + uVar17 * -0x50;
        if (len == 0x50) {
          auVar32._8_4_ = 0xbe0c56a1;
          auVar32._0_8_ = 0xbe0c56a1be0c56a1;
          auVar32._12_4_ = 0xbe0c56a1;
          auVar27._8_8_ = 0x5100000051;
          auVar27._0_8_ = 0x5100000051;
          auVar28._8_8_ = 0xe6546b64e6546b64;
          auVar28._0_8_ = 0xe6546b64e6546b64;
          auVar30._8_8_ = 0xbe0c56a1be0c56a1;
          auVar30._0_8_ = 0xbe0c56a1be0c56a1;
          auVar25 = auVar32;
        }
        else {
          auVar32._8_4_ = 0xbe0c56a1;
          auVar32._0_8_ = 0xbe0c56a1be0c56a1;
          auVar32._12_4_ = 0xbe0c56a1;
          auVar30._8_8_ = 0xbe0c56a1be0c56a1;
          auVar30._0_8_ = 0xbe0c56a1be0c56a1;
          auVar28._8_8_ = 0xe6546b64e6546b64;
          auVar28._0_8_ = 0xe6546b64e6546b64;
          auVar27._8_4_ = 0x51;
          auVar27._0_8_ = 0x5100000051;
          auVar27._12_4_ = 0x51;
          auVar23._8_4_ = 0xcc9e2d51;
          auVar23._0_8_ = 0xcc9e2d51cc9e2d51;
          auVar23._12_4_ = 0xcc9e2d51;
          pauVar19 = (undefined1 (*) [16])s;
          auVar25 = auVar32;
          do {
            auVar24 = *pauVar19;
            pauVar1 = pauVar19 + 2;
            pauVar2 = pauVar19 + 3;
            pauVar3 = pauVar19 + 1;
            pauVar4 = pauVar19 + 4;
            pauVar19 = pauVar19 + 5;
            uVar17 = uVar17 - 1;
            auVar27 = vpaddd_avx(auVar24,auVar27);
            auVar25 = vpaddd_avx(*pauVar1,auVar25);
            auVar32 = vpaddd_avx(*pauVar3,auVar32);
            auVar29 = vpmulld_avx(*pauVar4,auVar23);
            auVar30 = vpaddd_avx(*pauVar4,auVar30);
            auVar27 = vpaddd_avx(auVar27,auVar25);
            auVar26 = vpshufd_avx(auVar32,0x39);
            auVar25 = vpaddd_avx(auVar27,auVar25);
            auVar27 = vpaddd_avx(*pauVar2,auVar27);
            auVar27 = vprold_avx512vl(auVar27,0x11);
            auVar32 = vpaddd_avx(auVar29,*pauVar3);
            auVar27 = vpmulld_avx(auVar27,auVar23);
            auVar29 = vpshufb_avx(auVar26,auVar25);
            auVar24 = vpaddd_avx(*pauVar1 ^ auVar26,auVar24);
            auVar26 = vpshufb_avx(auVar30,auVar27);
            auVar28 = vpaddd_avx(auVar32,auVar28 ^ auVar29);
            auVar25 = vpaddd_avx(*pauVar2,auVar25 ^ auVar32);
            auVar28 = vpaddd_avx(auVar28,auVar26);
            auVar29 = vpaddd_avx(auVar30,auVar24);
            auVar30 = aesimc(auVar25);
            auVar32 = vpaddd_avx(auVar29,auVar24);
            auVar25 = vpmulld_avx(auVar29,auVar23);
          } while (uVar17 != 0);
          s = s + lVar6;
        }
        if (lVar9 != 0) {
          auVar26._8_4_ = 0xcc9e2d51;
          auVar26._0_8_ = 0xcc9e2d51cc9e2d51;
          auVar26._12_4_ = 0xcc9e2d51;
          auVar23 = vpbroadcastd_avx512vl();
          auVar27 = vpaddd_avx(auVar23,auVar27);
          auVar27 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar9 + -0x50),auVar27);
          auVar25 = vpaddd_avx(auVar25,*(undefined1 (*) [16])(s + lVar9 + -0x30));
          auVar32 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar9 + -0x40),auVar32);
          auVar23 = vpmulld_avx(*(undefined1 (*) [16])(s + lVar9 + -0x10),auVar26);
          auVar30 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar9 + -0x10),auVar30);
          auVar27 = vpaddd_avx(auVar27,auVar25);
          auVar29 = vpshufd_avx(auVar32,0x39);
          auVar25 = vpaddd_avx(auVar27,auVar25);
          auVar27 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar9 + -0x20),auVar27);
          auVar27 = vprold_avx512vl(auVar27,0x11);
          auVar32 = vpaddd_avx(auVar23,*(undefined1 (*) [16])(s + lVar9 + -0x40));
          auVar27 = vpmulld_avx(auVar27,auVar26);
          auVar24 = vpshufb_avx(auVar29,auVar25);
          auVar23 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar9 + -0x50),
                               auVar29 ^ *(undefined1 (*) [16])(s + lVar9 + -0x30));
          auVar29 = vpshufb_avx(auVar30,auVar27);
          auVar28 = vpaddd_avx(auVar32,auVar28 ^ auVar24);
          auVar25 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar9 + -0x20),auVar25 ^ auVar32);
          auVar28 = vpaddd_avx(auVar28,auVar29);
          auVar24 = vpaddd_avx(auVar30,auVar23);
          auVar30 = aesimc(auVar25);
          auVar32 = vpaddd_avx(auVar24,auVar23);
          auVar25 = vpmulld_avx(auVar24,auVar26);
        }
      }
      auVar32 = vpshufd_avx(auVar32,0x39);
      auVar34._8_4_ = 0x1b873593;
      auVar34._0_8_ = 0x1b8735931b873593;
      auVar34._12_4_ = 0x1b873593;
      auVar28 = vpternlogq_avx512vl(auVar28,auVar30,auVar32,0x96);
      auVar31._8_4_ = 0xcc9e2d51;
      auVar31._0_8_ = 0xcc9e2d51cc9e2d51;
      auVar31._12_4_ = 0xcc9e2d51;
      auVar30 = vpmulld_avx(auVar27 ^ auVar30,auVar34);
      auVar28 = vpmulld_avx(auVar28,auVar34);
      auVar27 = vpmulld_avx(auVar25,auVar31);
      auVar32 = vpmulld_avx(auVar32,auVar31);
      auVar25 = vpshufb_avx(auVar32,auVar27);
      auVar30 = vpaddd_avx(auVar30,auVar27);
      auVar27 = vpaddd_avx(auVar30,auVar27);
      auVar25 = vpaddd_avx(auVar28,auVar25);
      auVar23 = vpshufb_avx(auVar27,auVar30);
      auVar28 = vpaddd_avx(auVar25,auVar32);
      uVar11 = crc32(auVar27._0_4_,auVar27._12_4_);
      auVar25 = vpaddd_avx(auVar28,auVar25);
      iVar21 = crc32(auVar27._4_4_,auVar28._0_4_);
      auVar25 = auVar25 ^ auVar23;
      iVar22 = crc32(uVar11,auVar28._8_4_);
      uVar11 = crc32(auVar27._8_4_ * -0x3361d2af,auVar28._4_4_);
      iVar21 = crc32(iVar21 * -0x3361d2af,auVar28._12_4_);
      iVar14 = crc32(uVar11,auVar25._0_4_);
      uVar11 = crc32(iVar22 * -0x3361d2af,auVar25._4_4_);
      iVar22 = crc32(iVar21,auVar25._8_4_);
      uVar15 = crc32(iVar14 * -0x3361d2af,auVar25._12_4_);
      uVar11 = crc32(uVar11,auVar30._0_4_);
      iVar20 = crc32(iVar22 * -0x3361d2af,auVar30._4_4_);
      iVar14 = crc32(uVar15,auVar30._8_4_);
      iVar22 = crc32(uVar11,auVar30._12_4_);
      uVar8 = ((iVar20 + iVar21) - (iVar22 + iVar14)) * -0x3361d2af;
    }
    return uVar8;
  }
  if (len < 0xd) {
    if (len < 5) {
      if (len == 0) {
        uVar7 = 0;
        uVar10 = 9;
      }
      else {
        uVar10 = 9;
        uVar7 = 0;
        sVar16 = 0;
        do {
          pcVar5 = s + sVar16;
          sVar16 = sVar16 + 1;
          uVar7 = uVar7 * -0x3361d2af + (int)*pcVar5;
          uVar10 = uVar10 ^ uVar7;
        } while (len != sVar16);
      }
      uVar10 = (uVar12 * 0x16a88000 | uVar12 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar10;
      uVar12 = uVar10 >> 0x13 | uVar10 << 0xd;
    }
    else {
      iVar21 = *(int *)(s + (len - 4)) + uVar12 * 5;
      uVar7 = *(int *)(s + (ulong)(uVar12 >> 3 & 1) * 4) + 9;
      uVar12 = ((*(int *)s + uVar12) * 0x16a88000 | (*(int *)s + uVar12) * -0x3361d2af >> 0x11) *
               0x1b873593 ^ uVar12 * 5;
      uVar12 = (iVar21 * 0x16a88000 | (uint)(iVar21 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
               (uVar12 >> 0x13 | uVar12 << 0xd) * 5 + 0xe6546b64;
      uVar12 = uVar12 >> 0x13 | uVar12 << 0xd;
    }
    uVar12 = (uVar7 * 0x16a88000 | uVar7 * -0x3361d2af >> 0x11) * 0x1b873593 ^
             uVar12 * 5 + 0xe6546b64;
    uVar12 = (uVar12 >> 0x13 | uVar12 << 0xd) * 5 + 0xe6546b64;
    uVar12 = uVar12 >> 0x10 ^ uVar12;
  }
  else {
    iVar21 = *(int *)(s + (len - 8));
    uVar7 = (*(uint *)(s + ((len >> 1) - 4)) >> 0xc | *(uint *)(s + ((len >> 1) - 4)) << 0x14) +
            *(int *)(s + (len - 4));
    uVar12 = (iVar21 * 0x16a88000 | (uint)(iVar21 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
             uVar12 + *(int *)(s + (len >> 1)) * -0x3361d2af;
    iVar21 = (uVar7 >> 3 | uVar7 * 0x20000000) + iVar21;
    uVar12 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
             (uVar12 >> 0x13 | uVar12 << 0xd) * 5 + uVar7 + 0xe6546b64;
    uVar7 = iVar21 + *(int *)(s + (len - 4));
    uVar12 = (*(int *)(s + 4) * 0x16a88000 | (uint)(*(int *)(s + 4) * -0x3361d2af) >> 0x11) *
             0x1b873593 ^ (uVar12 >> 0x13 | uVar12 << 0xd) * 5 + iVar21 + -0x19ab949c;
    uVar12 = (uVar7 >> 0xc | uVar7 * 0x100000) + *(int *)(s + (len >> 1)) + -0x19ab949c +
             (uVar12 >> 0x13 | uVar12 << 0xd) * 5;
    uVar12 = uVar12 >> 0x10 ^ uVar12;
  }
  uVar12 = (uVar12 * -0x7a143595 >> 0xd ^ uVar12 * -0x7a143595) * -0x3d4d51cb;
  return uVar12 >> 0x10 ^ uVar12;
}

Assistant:

uint32_t Hash32(const char *s, size_t len) {
  const uint32_t seed = 81;
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ?
         farmhashmk::Hash32Len0to4(s, len) :
         farmhashmk::Hash32Len5to12(s, len)) :
        farmhashmk::Hash32Len13to24(s, len);
  }

  if (len < 40) {
    uint32_t a = len, b = seed * c2, c = a + b;
    a += Fetch(s + len - 4);
    b += Fetch(s + len - 20);
    c += Fetch(s + len - 16);
    uint32_t d = a;
    a = NAMESPACE_FOR_HASH_FUNCTIONS::Rotate32(a, 21);
    a = Mur(a, Mur(b, _mm_crc32_u32(c, d)));
    a += Fetch(s + len - 12);
    b += Fetch(s + len - 8);
    d += a;
    a += d;
    b = Mur(b, d) * c2;
    a = _mm_crc32_u32(a, b + c);
    return farmhashmk::Hash32Len13to24(s, (len + 1) / 2, a) + b;
  }

#undef Mulc1
#define Mulc1(x) Mul((x), cc1)

#undef Mulc2
#define Mulc2(x) Mul((x), cc2)

#undef Murk
#define Murk(a, h)                              \
  Add(k,                                        \
      Mul5(                                     \
          Rol19(                                \
              Xor(                              \
                  Mulc2(                        \
                      Rol17(                    \
                          Mulc1(a))),           \
                  (h)))))

  const __m128i cc1 = _mm_set1_epi32(c1);
  const __m128i cc2 = _mm_set1_epi32(c2);
  __m128i h = _mm_set1_epi32(seed);
  __m128i g = _mm_set1_epi32(c1 * seed);
  __m128i f = g;
  __m128i k = _mm_set1_epi32(0xe6546b64);
  __m128i q;
  if (len < 80) {
    __m128i a = Fetch128(s);
    __m128i b = Fetch128(s + 16);
    __m128i c = Fetch128(s + (len - 15) / 2);
    __m128i d = Fetch128(s + len - 32);
    __m128i e = Fetch128(s + len - 16);
    h = Add(h, a);
    g = Add(g, b);
    q = g;
    g = Shuffle0321(g);
    f = Add(f, c);
    __m128i be = Add(b, Mulc1(e));
    h = Add(h, f);
    f = Add(f, h);
    h = Add(Murk(d, h), e);
    k = Xor(k, _mm_shuffle_epi8(g, f));
    g = Add(Xor(c, g), a);
    f = Add(Xor(be, f), d);
    k = Add(k, be);
    k = Add(k, _mm_shuffle_epi8(f, h));
    f = Add(f, g);
    g = Add(g, f);
    g = Add(_mm_set1_epi32(len), Mulc1(g));
  } else {
    // len >= 80
    // The following is loosely modelled after farmhashmk::Hash32.
    size_t iters = (len - 1) / 80;
    len -= iters * 80;

#undef Chunk
#define Chunk() do {                            \
  __m128i a = Fetch128(s);                      \
  __m128i b = Fetch128(s + 16);                 \
  __m128i c = Fetch128(s + 32);                 \
  __m128i d = Fetch128(s + 48);                 \
  __m128i e = Fetch128(s + 64);                 \
  h = Add(h, a);                                \
  g = Add(g, b);                                \
  g = Shuffle0321(g);                           \
  f = Add(f, c);                                \
  __m128i be = Add(b, Mulc1(e));                \
  h = Add(h, f);                                \
  f = Add(f, h);                                \
  h = Add(h, d);                                \
  q = Add(q, e);                                \
  h = Rol17(h);                                 \
  h = Mulc1(h);                                 \
  k = Xor(k, _mm_shuffle_epi8(g, f));           \
  g = Add(Xor(c, g), a);                        \
  f = Add(Xor(be, f), d);                       \
  std::swap(f, q);                              \
  q = _mm_aesimc_si128(q);                      \
  k = Add(k, be);                               \
  k = Add(k, _mm_shuffle_epi8(f, h));           \
  f = Add(f, g);                                \
  g = Add(g, f);                                \
  f = Mulc1(f);                                 \
} while (0)

    q = g;
    while (iters-- != 0) {
      Chunk();
      s += 80;
    }

    if (len != 0) {
      h = Add(h, _mm_set1_epi32(len));
      s = s + len - 80;
      Chunk();
    }
  }

  g = Shuffle0321(g);
  k = Xor(k, g);
  k = Xor(k, q);
  h = Xor(h, q);
  f = Mulc1(f);
  k = Mulc2(k);
  g = Mulc1(g);
  h = Mulc2(h);
  k = Add(k, _mm_shuffle_epi8(g, f));
  h = Add(h, f);
  f = Add(f, h);
  g = Add(g, k);
  k = Add(k, g);
  k = Xor(k, _mm_shuffle_epi8(f, h));
  __m128i buf[4];
  buf[0] = f;
  buf[1] = g;
  buf[2] = k;
  buf[3] = h;
  s = reinterpret_cast<char*>(buf);
  uint32_t x = Fetch(s);
  uint32_t y = Fetch(s+4);
  uint32_t z = Fetch(s+8);
  x = _mm_crc32_u32(x, Fetch(s+12));
  y = _mm_crc32_u32(y, Fetch(s+16));
  z = _mm_crc32_u32(z * c1, Fetch(s+20));
  x = _mm_crc32_u32(x, Fetch(s+24));
  y = _mm_crc32_u32(y * c1, Fetch(s+28));
  uint32_t o = y;
  z = _mm_crc32_u32(z, Fetch(s+32));
  x = _mm_crc32_u32(x * c1, Fetch(s+36));
  y = _mm_crc32_u32(y, Fetch(s+40));
  z = _mm_crc32_u32(z * c1, Fetch(s+44));
  x = _mm_crc32_u32(x, Fetch(s+48));
  y = _mm_crc32_u32(y * c1, Fetch(s+52));
  z = _mm_crc32_u32(z, Fetch(s+56));
  x = _mm_crc32_u32(x, Fetch(s+60));
  return (o - x + y - z) * c1;
}